

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

size_t secp256k1_context_preallocated_size(uint flags)

{
  size_t local_20;
  size_t ret;
  size_t sStack_10;
  uint flags_local;
  
  if ((flags & 0xff) == 1) {
    local_20 = 0xe0;
    if ((flags & 0x100) != 0) {
      local_20 = 0x800e0;
    }
    sStack_10 = local_20;
  }
  else {
    secp256k1_callback_call(&default_illegal_callback,"Invalid flags");
    sStack_10 = 0;
  }
  return sStack_10;
}

Assistant:

size_t secp256k1_context_preallocated_size(unsigned int flags) {
    size_t ret = ROUND_TO_ALIGN(sizeof(secp256k1_context));

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Invalid flags");
            return 0;
    }

    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        ret += SECP256K1_ECMULT_GEN_CONTEXT_PREALLOCATED_SIZE;
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        ret += SECP256K1_ECMULT_CONTEXT_PREALLOCATED_SIZE;
    }
    return ret;
}